

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittests.cc
# Opt level: O0

void __thiscall
anon_unknown.dwarf_30c12::createDFDCompressedTest1x16_FormatASTC_5x4_Test::
~createDFDCompressedTest1x16_FormatASTC_5x4_Test
          (createDFDCompressedTest1x16_FormatASTC_5x4_Test *this)

{
  void *in_RDI;
  
  ~createDFDCompressedTest1x16_FormatASTC_5x4_Test
            ((createDFDCompressedTest1x16_FormatASTC_5x4_Test *)0x149fb8);
  operator_delete(in_RDI,0x38);
  return;
}

Assistant:

TEST_F(createDFDCompressedTest1x16, FormatASTC_5x4) {
    customize(KHR_DF_MODEL_ASTC, KHR_DF_PRIMARIES_BT709,
              KHR_DF_TRANSFER_LINEAR, KHR_DF_FLAG_ALPHA_STRAIGHT,
              4, 3,
              {
                {0, 127, KHR_DF_CHANNEL_ASTC_DATA, 0, 0, 0, 0, 0, 0xFFFFFFFF},
              }
             );

    uint32_t* dfd = createDFDCompressed(c_ASTC, 5, 4, 1, s_UNORM);

    EXPECT_EQ(*dfd, sizeof(expected) + 4U);
    EXPECT_EQ(memcmp(&expected, dfd+1, sizeof(expected)), 0);

    free(dfd);
}